

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O0

int cmBZRXMLParserUnknownEncodingHandler(void *param_1,XML_Char *name,XML_Encoding *info)

{
  bool bVar1;
  bool bVar2;
  XML_Encoding *pXVar3;
  bool bVar4;
  bool local_c2;
  uint local_b0;
  allocator local_a9;
  uint i;
  byte local_83;
  byte local_82;
  allocator local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  allocator local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  XML_Encoding *local_28;
  XML_Encoding *info_local;
  XML_Char *name_local;
  void *param_1_local;
  
  local_28 = info;
  info_local = (XML_Encoding *)name;
  name_local = (XML_Char *)param_1;
  std::allocator<char>::allocator();
  local_82 = 0;
  local_83 = 0;
  bVar2 = false;
  bVar1 = false;
  std::__cxx11::string::string((string *)&local_48,"ascii",&local_49);
  bVar4 = std::operator==(name,&local_48);
  pXVar3 = info_local;
  local_c2 = true;
  if (!bVar4) {
    std::allocator<char>::allocator();
    local_82 = 1;
    std::__cxx11::string::string((string *)&local_80,"cp1252",&local_81);
    local_83 = 1;
    bVar4 = std::operator==((char *)pXVar3,&local_80);
    pXVar3 = info_local;
    local_c2 = true;
    if (!bVar4) {
      std::allocator<char>::allocator();
      bVar2 = true;
      std::__cxx11::string::string((string *)&i,"ANSI_X3.4-1968",&local_a9);
      bVar1 = true;
      local_c2 = std::operator==((char *)pXVar3,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&i);
    }
  }
  if (bVar1) {
    std::__cxx11::string::~string((string *)&i);
  }
  if (bVar2) {
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  }
  if ((local_83 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_80);
  }
  if ((local_82 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
  }
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if (local_c2 == false) {
    param_1_local._4_4_ = 0;
  }
  else {
    for (local_b0 = 0; local_b0 < 0x100; local_b0 = local_b0 + 1) {
      local_28->map[local_b0] = cmBZRXMLParserUnknownEncodingHandler::latin1[local_b0];
    }
    param_1_local._4_4_ = 1;
  }
  return param_1_local._4_4_;
}

Assistant:

int cmBZRXMLParserUnknownEncodingHandler(void*,
                                         const XML_Char *name,
                                         XML_Encoding *info)
{
  static const int latin1[]=
    {
      0x0000, 0x0001, 0x0002, 0x0003, 0x0004, 0x0005, 0x0006, 0x0007,
      0x0008, 0x0009, 0x000A, 0x000B, 0x000C, 0x000D, 0x000E, 0x000F,
      0x0010, 0x0011, 0x0012, 0x0013, 0x0014, 0x0015, 0x0016, 0x0017,
      0x0018, 0x0019, 0x001A, 0x001B, 0x001C, 0x001D, 0x001E, 0x001F,
      0x0020, 0x0021, 0x0022, 0x0023, 0x0024, 0x0025, 0x0026, 0x0027,
      0x0028, 0x0029, 0x002A, 0x002B, 0x002C, 0x002D, 0x002E, 0x002F,
      0x0030, 0x0031, 0x0032, 0x0033, 0x0034, 0x0035, 0x0036, 0x0037,
      0x0038, 0x0039, 0x003A, 0x003B, 0x003C, 0x003D, 0x003E, 0x003F,
      0x0040, 0x0041, 0x0042, 0x0043, 0x0044, 0x0045, 0x0046, 0x0047,
      0x0048, 0x0049, 0x004A, 0x004B, 0x004C, 0x004D, 0x004E, 0x004F,
      0x0050, 0x0051, 0x0052, 0x0053, 0x0054, 0x0055, 0x0056, 0x0057,
      0x0058, 0x0059, 0x005A, 0x005B, 0x005C, 0x005D, 0x005E, 0x005F,
      0x0060, 0x0061, 0x0062, 0x0063, 0x0064, 0x0065, 0x0066, 0x0067,
      0x0068, 0x0069, 0x006A, 0x006B, 0x006C, 0x006D, 0x006E, 0x006F,
      0x0070, 0x0071, 0x0072, 0x0073, 0x0074, 0x0075, 0x0076, 0x0077,
      0x0078, 0x0079, 0x007A, 0x007B, 0x007C, 0x007D, 0x007E, 0x007F,
      0x20AC, 0x0081, 0x201A, 0x0192, 0x201E, 0x2026, 0x2020, 0x2021,
      0x02C6, 0x2030, 0x0160, 0x2039, 0x0152, 0x008D, 0x017D, 0x008F,
      0x0090, 0x2018, 0x2019, 0x201C, 0x201D, 0x2022, 0x2013, 0x2014,
      0x02DC, 0x2122, 0x0161, 0x203A, 0x0153, 0x009D, 0x017E, 0x0178,
      0x00A0, 0x00A1, 0x00A2, 0x00A3, 0x00A4, 0x00A5, 0x00A6, 0x00A7,
      0x00A8, 0x00A9, 0x00AA, 0x00AB, 0x00AC, 0x00AD, 0x00AE, 0x00AF,
      0x00B0, 0x00B1, 0x00B2, 0x00B3, 0x00B4, 0x00B5, 0x00B6, 0x00B7,
      0x00B8, 0x00B9, 0x00BA, 0x00BB, 0x00BC, 0x00BD, 0x00BE, 0x00BF,
      0x00C0, 0x00C1, 0x00C2, 0x00C3, 0x00C4, 0x00C5, 0x00C6, 0x00C7,
      0x00C8, 0x00C9, 0x00CA, 0x00CB, 0x00CC, 0x00CD, 0x00CE, 0x00CF,
      0x00D0, 0x00D1, 0x00D2, 0x00D3, 0x00D4, 0x00D5, 0x00D6, 0x00D7,
      0x00D8, 0x00D9, 0x00DA, 0x00DB, 0x00DC, 0x00DD, 0x00DE, 0x00DF,
      0x00E0, 0x00E1, 0x00E2, 0x00E3, 0x00E4, 0x00E5, 0x00E6, 0x00E7,
      0x00E8, 0x00E9, 0x00EA, 0x00EB, 0x00EC, 0x00ED, 0x00EE, 0x00EF,
      0x00F0, 0x00F1, 0x00F2, 0x00F3, 0x00F4, 0x00F5, 0x00F6, 0x00F7,
      0x00F8, 0x00F9, 0x00FA, 0x00FB, 0x00FC, 0x00FD, 0x00FE, 0x00FF
    };

  // The BZR xml output plugin can use some encodings that are not
  // recognized by expat.  This will lead to an error, e.g. "Error
  // parsing bzr log xml: unknown encoding", the following is a
  // workaround for these unknown encodings.
  if(name == std::string("ascii") || name == std::string("cp1252") ||
     name == std::string("ANSI_X3.4-1968"))
    {
    for(unsigned int i=0;i<256;++i) info->map[i] = latin1[i];
    return 1;
    }

  return 0;
}